

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

uint64_t uv__read_proc_meminfo(char *what)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint64_t rc;
  char buf [4096];
  long local_1020;
  char local_1018 [4104];
  
  iVar1 = uv__slurp("/proc/meminfo",local_1018,0x1000);
  if ((iVar1 == 0) && (pcVar2 = strstr(local_1018,what), pcVar2 != (char *)0x0)) {
    sVar3 = strlen(what);
    local_1020 = 0;
    __isoc99_sscanf(pcVar2 + sVar3,"%lu kB",&local_1020);
    return local_1020 << 10;
  }
  return 0;
}

Assistant:

static uint64_t uv__read_proc_meminfo(const char* what) {
  uint64_t rc;
  char* p;
  char buf[4096];  /* Large enough to hold all of /proc/meminfo. */

  if (uv__slurp("/proc/meminfo", buf, sizeof(buf)))
    return 0;

  p = strstr(buf, what);

  if (p == NULL)
    return 0;

  p += strlen(what);

  rc = 0;
  sscanf(p, "%" PRIu64 " kB", &rc);

  return rc * 1024;
}